

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_duplex_rb_init(ma_format captureFormat,ma_uint32 captureChannels,ma_uint32 sampleRate,
                           ma_uint32 captureInternalSampleRate,
                           ma_uint32 captureInternalPeriodSizeInFrames,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_duplex_rb *pRB)

{
  ma_result mVar1;
  ma_uint64 mVar2;
  
  mVar2 = ma_calculate_frame_count_after_resampling
                    (sampleRate,captureInternalSampleRate,
                     (ulong)(captureInternalPeriodSizeInFrames * 5));
  if ((ma_uint32)mVar2 == 0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = ma_pcm_rb_init(captureFormat,captureChannels,(ma_uint32)mVar2,(void *)0x0,
                           pAllocationCallbacks,&pRB->rb);
    if (mVar1 == MA_SUCCESS) {
      ma_pcm_rb_seek_write(&pRB->rb,captureInternalPeriodSizeInFrames * 2);
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_duplex_rb_init(ma_format captureFormat, ma_uint32 captureChannels, ma_uint32 sampleRate, ma_uint32 captureInternalSampleRate, ma_uint32 captureInternalPeriodSizeInFrames, const ma_allocation_callbacks* pAllocationCallbacks, ma_duplex_rb* pRB)
{
    ma_result result;
    ma_uint32 sizeInFrames;

    sizeInFrames = (ma_uint32)ma_calculate_frame_count_after_resampling(sampleRate, captureInternalSampleRate, captureInternalPeriodSizeInFrames * 5);
    if (sizeInFrames == 0) {
        return MA_INVALID_ARGS;
    }

    result = ma_pcm_rb_init(captureFormat, captureChannels, sizeInFrames, NULL, pAllocationCallbacks, &pRB->rb);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* Seek forward a bit so we have a bit of a buffer in case of desyncs. */
    ma_pcm_rb_seek_write((ma_pcm_rb*)pRB, captureInternalPeriodSizeInFrames * 2);

    return MA_SUCCESS;
}